

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O3

void __thiscall
cmMakefile::BuildsystemFileScope::BuildsystemFileScope(BuildsystemFileScope *this,cmMakefile *mf)

{
  pointer pcVar1;
  cmMakefile *pcVar2;
  cmGlobalGenerator *pcVar3;
  cmake *pcVar4;
  PositionType PVar5;
  cmLinkedTree<cmStateDetail::SnapshotDataType> *pcVar6;
  string *psVar7;
  cmState *pcVar8;
  string currentStart;
  string local_78;
  cmStateDirectory local_58;
  
  this->Makefile = mf;
  cmStateSnapshot::cmStateSnapshot(&this->Snapshot,(cmState *)0x0);
  this->ReportError = true;
  cmStateSnapshot::GetDirectory(&local_58,&this->Makefile->StateSnapshot);
  psVar7 = cmStateDirectory::GetCurrentSource_abi_cxx11_(&local_58);
  pcVar1 = (psVar7->_M_dataplus)._M_p;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar1,pcVar1 + psVar7->_M_string_length);
  std::__cxx11::string::append((char *)&local_78);
  cmStateSnapshot::SetListFile(&this->Makefile->StateSnapshot,&local_78);
  pcVar8 = cmStateSnapshot::GetState(&this->Makefile->StateSnapshot);
  cmState::CreatePolicyScopeSnapshot
            ((cmStateSnapshot *)&local_58,pcVar8,&this->Makefile->StateSnapshot);
  pcVar2 = this->Makefile;
  (pcVar2->StateSnapshot).Position.Position = (PositionType)local_58.Snapshot_.State;
  (pcVar2->StateSnapshot).State = (cmState *)local_58.DirectoryState.Tree;
  (pcVar2->StateSnapshot).Position.Tree =
       (cmLinkedTree<cmStateDetail::SnapshotDataType> *)local_58.DirectoryState.Position;
  PushFunctionBlockerBarrier(this->Makefile);
  pcVar3 = mf->GlobalGenerator;
  this->GG = pcVar3;
  this->CurrentMakefile = pcVar3->CurrentConfigureMakefile;
  pcVar4 = pcVar3->CMakeInstance;
  pcVar8 = (pcVar4->CurrentSnapshot).State;
  pcVar6 = (pcVar4->CurrentSnapshot).Position.Tree;
  PVar5 = (pcVar4->CurrentSnapshot).Position.Position;
  (this->Snapshot).Position.Position = PVar5;
  (this->Snapshot).State = pcVar8;
  (this->Snapshot).Position.Tree = pcVar6;
  pcVar4 = pcVar3->CMakeInstance;
  (pcVar4->CurrentSnapshot).Position.Position = PVar5;
  (pcVar4->CurrentSnapshot).State = pcVar8;
  (pcVar4->CurrentSnapshot).Position.Tree = pcVar6;
  pcVar3 = this->GG;
  pcVar3->CurrentConfigureMakefile = mf;
  cmFileLockPool::PushFileScope(&pcVar3->FileLockPool);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

BuildsystemFileScope(cmMakefile* mf)
    : Makefile(mf)
    , ReportError(true)
  {
    std::string currentStart =
      this->Makefile->StateSnapshot.GetDirectory().GetCurrentSource();
    currentStart += "/CMakeLists.txt";
    this->Makefile->StateSnapshot.SetListFile(currentStart);
    this->Makefile->StateSnapshot =
      this->Makefile->StateSnapshot.GetState()->CreatePolicyScopeSnapshot(
        this->Makefile->StateSnapshot);
    this->Makefile->PushFunctionBlockerBarrier();

    this->GG = mf->GetGlobalGenerator();
    this->CurrentMakefile = this->GG->GetCurrentMakefile();
    this->Snapshot = this->GG->GetCMakeInstance()->GetCurrentSnapshot();
    this->GG->GetCMakeInstance()->SetCurrentSnapshot(this->Snapshot);
    this->GG->SetCurrentMakefile(mf);
#if defined(CMAKE_BUILD_WITH_CMAKE)
    this->GG->GetFileLockPool().PushFileScope();
#endif
  }